

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void armci_msg_bcast_scope(int scope,void *buffer,int len,int root)

{
  int in_ECX;
  int in_EDX;
  void *in_RSI;
  int in_EDI;
  MPI_Comm comm;
  int in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  
  if ((in_EDI == 0x14d) || (in_EDI == 0x153)) {
    armci_msg_bcast(in_RSI,in_EDX,in_ECX);
  }
  else if (in_EDI == 0x151) {
    if (in_RSI == (void *)0x0) {
      __assert_fail("buffer != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                    ,0x14e,"void armci_msg_bcast_scope(int, void *, int, int)");
    }
    comex_group_comm((comex_group_t)((ulong)in_RSI >> 0x20),(MPI_Comm *)CONCAT44(in_EDX,in_ECX));
    MPI_Bcast(in_RSI,in_EDX,&ompi_mpi_byte,in_ECX,in_stack_ffffffffffffffe0);
  }
  else {
    comex_error(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

void armci_msg_bcast_scope(int scope, void* buffer, int len, int root)
{
    if (SCOPE_ALL == scope || SCOPE_MASTERS == scope) {
        armci_msg_bcast(buffer, len, root);
    }
    else if (SCOPE_NODE == scope) {
        MPI_Comm comm;
        assert(buffer != NULL);
        comex_group_comm(ARMCI_Node_group,&comm);
        MPI_Bcast(buffer, len, MPI_BYTE, root, comm);
    }
    else {
        comex_error("unsupported armci_msg_bcast_scope scope", 1);
    }
}